

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  _func_int **pp_Var1;
  _Rb_tree_node_base *p_Var2;
  uchar *puVar3;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  _Base_ptr p_Var4;
  undefined8 uVar5;
  char *pcVar6;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *val_00;
  pointer pcVar7;
  element_type *peVar8;
  uint uVar9;
  const_iterator i_1;
  pointer pbVar11;
  const_iterator i;
  ulong uVar12;
  uchar *puVar13;
  ulong uVar10;
  
  if (discarded < val->m_type) {
    return;
  }
  switch(val->m_type) {
  case null:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar8->_vptr_output_adapter_protocol[1];
    pcVar6 = "null";
    break;
  case object:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pp_Var1 = peVar8->_vptr_output_adapter_protocol;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
      pcVar6 = "{}";
      goto LAB_001307f9;
    }
    if (pretty_print) {
      (*pp_Var1[1])(peVar8,"{\n",2);
      uVar9 = current_indent + indent_step;
      uVar10 = (ulong)uVar9;
      uVar12 = (this->indent_string)._M_string_length;
      if (uVar12 < uVar10) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar12 * '\x02');
      }
      p_Var2 = (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
        uVar12 = 0;
        do {
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar8->_vptr_output_adapter_protocol[1])
                    (peVar8,(this->indent_string)._M_dataplus._M_p,uVar10);
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x22);
          dump_escaped(this,(string_t *)(p_Var2 + 1),ensure_ascii);
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"\": ",3);
          dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(p_Var2 + 2),true,ensure_ascii,indent_step,uVar9);
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,",\n",2);
          uVar12 = uVar12 + 1;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        } while (uVar12 < (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header.
                          _M_node_count - 1);
      }
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar8->_vptr_output_adapter_protocol[1])
                (peVar8,(this->indent_string)._M_dataplus._M_p,uVar10);
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x22);
      dump_escaped(this,(string_t *)(p_Var2 + 1),ensure_ascii);
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"\": ",3);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)(p_Var2 + 2),true,ensure_ascii,indent_step,uVar9);
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (**peVar8->_vptr_output_adapter_protocol)(peVar8,10);
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pcVar7 = (this->indent_string)._M_dataplus._M_p;
      goto LAB_001308d4;
    }
    (**pp_Var1)(peVar8,0x7b);
    p_Var4 = (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
      uVar12 = 0;
      do {
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x22);
        dump_escaped(this,(string_t *)(p_Var4 + 1),ensure_ascii);
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"\":",2);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(p_Var4 + 2),false,ensure_ascii,indent_step,current_indent);
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x2c);
        uVar12 = uVar12 + 1;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while (uVar12 < (((val->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                        - 1);
    }
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x22);
    dump_escaped(this,(string_t *)(p_Var4 + 1),ensure_ascii);
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"\":",2);
    dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)(p_Var4 + 2),false,ensure_ascii,indent_step,current_indent);
    goto LAB_001309d5;
  case array:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pp_Var1 = peVar8->_vptr_output_adapter_protocol;
    if ((((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (((val->m_value).array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var1[1])(peVar8,"[\n",2);
        uVar9 = current_indent + indent_step;
        uVar10 = (ulong)uVar9;
        uVar12 = (this->indent_string)._M_string_length;
        if (uVar12 < uVar10) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar12 * '\x02');
        }
        pbVar11 = (((val->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar11 !=
            (((val->m_value).array)->
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish + -1) {
          do {
            peVar8 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar8->_vptr_output_adapter_protocol[1])
                      (peVar8,(this->indent_string)._M_dataplus._M_p,uVar10);
            dump(this,pbVar11,true,ensure_ascii,indent_step,uVar9);
            peVar8 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,",\n",2);
            pbVar11 = pbVar11 + 1;
          } while (pbVar11 !=
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)(((val->m_value).string)->_M_string_length - 0x10));
        }
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar8->_vptr_output_adapter_protocol[1])
                  (peVar8,(this->indent_string)._M_dataplus._M_p,uVar10);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(((val->m_value).string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar9);
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (**peVar8->_vptr_output_adapter_protocol)(peVar8,10);
        peVar8 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar8->_vptr_output_adapter_protocol[1])
                  (peVar8,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var1)(peVar8,0x5b);
        pbVar11 = (((val->m_value).array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        val_00 = (((val->m_value).array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1;
        if (pbVar11 != val_00) {
          do {
            dump(this,pbVar11,false,ensure_ascii,indent_step,current_indent);
            peVar8 = (this->o).
                     super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x2c);
            pbVar11 = pbVar11 + 1;
            val_00 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)(((val->m_value).string)->_M_string_length - 0x10);
          } while (pbVar11 != val_00);
        }
        dump(this,val_00,false,ensure_ascii,indent_step,current_indent);
      }
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar8->_vptr_output_adapter_protocol;
      uVar5 = 0x5d;
      goto LAB_001309e3;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var1[1];
    pcVar6 = "[]";
LAB_001307f9:
    uVar5 = 2;
    goto LAB_001308f5;
  case string:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x22);
    dump_escaped(this,(string_t *)(val->m_value).object,ensure_ascii);
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar8->_vptr_output_adapter_protocol;
    uVar5 = 0x22;
    goto LAB_001309e3;
  case boolean:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar8->_vptr_output_adapter_protocol[1];
    if ((val->m_value).boolean != true) {
      pcVar6 = "false";
LAB_001308f0:
      uVar5 = 5;
      goto LAB_001308f5;
    }
    pcVar6 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_value).number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_value).number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_value).number_float);
    return;
  case binary:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (!pretty_print) {
      (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"{\"bytes\":[",10);
      puVar13 = (((val->m_value).binary)->
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar13 != puVar3) {
        for (; puVar13 != puVar3 + -1; puVar13 = puVar13 + 1) {
          dump_integer<unsigned_char,_0>(this,*puVar13);
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (**peVar8->_vptr_output_adapter_protocol)(peVar8,0x2c);
          puVar3 = (uchar *)((val->m_value).string)->_M_string_length;
        }
        dump_integer<unsigned_char,_0>(this,puVar3[-1]);
      }
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"],\"subtype\":",0xc);
      if (((val->m_value).binary)->m_has_subtype == true) {
        dump_integer<unsigned_char,_0>(this,((val->m_value).binary)->m_subtype);
        goto LAB_001309d5;
      }
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = peVar8->_vptr_output_adapter_protocol[1];
      pcVar6 = "null}";
      goto LAB_001308f0;
    }
    (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"{\n",2);
    uVar10 = (ulong)(indent_step + current_indent);
    uVar12 = (this->indent_string)._M_string_length;
    if (uVar12 < uVar10) {
      std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar12 * '\x02');
    }
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar8->_vptr_output_adapter_protocol[1])
              (peVar8,(this->indent_string)._M_dataplus._M_p,uVar10);
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"\"bytes\": [",10);
    puVar13 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
              .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (((val->m_value).binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar13 != puVar3) {
      puVar3 = puVar3 + -1;
      if (puVar13 != puVar3) {
        do {
          dump_integer<unsigned_char,_0>(this,*puVar13);
          peVar8 = (this->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,", ",2);
          puVar13 = puVar13 + 1;
          puVar3 = (uchar *)(((val->m_value).string)->_M_string_length - 1);
        } while (puVar13 != puVar3);
      }
      dump_integer<unsigned_char,_0>(this,*puVar3);
    }
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"],\n",3);
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar8->_vptr_output_adapter_protocol[1])
              (peVar8,(this->indent_string)._M_dataplus._M_p,uVar10);
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"\"subtype\": ",0xb);
    if (((val->m_value).binary)->m_has_subtype == true) {
      dump_integer<unsigned_char,_0>(this,((val->m_value).binary)->m_subtype);
    }
    else {
      peVar8 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,"null",4);
    }
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**peVar8->_vptr_output_adapter_protocol)(peVar8,10);
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar7 = (this->indent_string)._M_dataplus._M_p;
LAB_001308d4:
    (*peVar8->_vptr_output_adapter_protocol[1])(peVar8,pcVar7,(ulong)current_indent);
LAB_001309d5:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar8->_vptr_output_adapter_protocol;
    uVar5 = 0x7d;
LAB_001309e3:
    (*UNRECOVERED_JUMPTABLE_00)(peVar8,uVar5);
    return;
  case discarded:
    peVar8 = (this->o).
             super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar8->_vptr_output_adapter_protocol[1];
    pcVar6 = "<discarded>";
    uVar5 = 0xb;
    goto LAB_001308f5;
  }
  uVar5 = 4;
LAB_001308f5:
  (*UNRECOVERED_JUMPTABLE_00)(peVar8,pcVar6,uVar5);
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_type)
        {
            case value_t::object:
            {
                if (val.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_value.array->cbegin();
                            i != val.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_value.array->empty());
                    dump(val.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_value.binary->empty())
                    {
                        for (auto i = val.m_value.binary->cbegin();
                                i != val.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false);  // LCOV_EXCL_LINE
        }
    }